

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStack.cpp
# Opt level: O0

bool __thiscall JSON::JSONStack::Push(JSONStack *this,Var data,bool bJsObject)

{
  uint uVar1;
  int iVar2;
  bool local_22;
  bool result;
  Var pvStack_20;
  bool bJsObject_local;
  Var data_local;
  JSONStack *this_local;
  
  pvStack_20 = data;
  data_local = this;
  if (bJsObject) {
    local_22 = true;
    if (this->tempValues[0] != (Var)0x0) {
      SList<void_*,_Memory::ArenaAllocator,_RealCount>::Push(&this->jsObjectStack,this->tempValues);
      this->tempValues[0] = (Var)0x0;
    }
    uVar1 = RealCount::Count(&(this->jsObjectStack).
                              super_SListBase<void_*,_Memory::ArenaAllocator,_RealCount>.
                              super_RealCount);
    if (uVar1 == 0) {
      this->tempValues[0] = pvStack_20;
    }
    else {
      local_22 = SList<void_*,_Memory::ArenaAllocator,_RealCount>::Push
                           (&this->jsObjectStack,&stack0xffffffffffffffe0);
    }
    this_local._7_1_ = local_22;
  }
  else {
    EnsuresDomObjectStack(this);
    if (this->tempValues[1] != (Var)0x0) {
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::Add(this->domObjectStack,this->tempValues + 1);
      this->tempValues[1] = (Var)0x0;
    }
    iVar2 = JsUtil::
            ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
            ::Count(&this->domObjectStack->
                     super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
                   );
    if (iVar2 == 0) {
      this->tempValues[1] = pvStack_20;
    }
    else {
      JsUtil::
      List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_SpecializedComparer<void_*,_JSON::StrictEqualsObjectComparer>::TComparerType>
      ::Add(this->domObjectStack,&stack0xffffffffffffffe0);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool JSONStack::Push(Js::Var data, bool bJsObject)
    {
        if (bJsObject)
        {
            bool result = true;
            if (_JS_VALUE)
            {
                jsObjectStack.Push(_JS_VALUE);
                _JS_VALUE = nullptr;
            }

            if (jsObjectStack.Count())
            {
                result = jsObjectStack.Push(data);
            }
            else
            {
                _JS_VALUE = data;
            }

            return result;
        }

        EnsuresDomObjectStack();

        if (_DOM_VALUE)
        {
            domObjectStack->Add(_DOM_VALUE);
            _DOM_VALUE = nullptr;
        }

        if (domObjectStack->Count())
        {
            domObjectStack->Add(data);
        }
        else
        {
            _DOM_VALUE = data;
        }
        return true;
    }